

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O2

void wabt::cat_concatenate<std::__cxx11::string,char[2],char_const*>
               (string *s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               char (*args) [2],char **args_1)

{
  std::__cxx11::string::append((string *)s);
  cat_concatenate<char[2],char_const*>(s,args,args_1);
  return;
}

Assistant:

void cat_concatenate(std::string& s, const T& t, const Ts&... args) {
  s += t;
  cat_concatenate(s, args...);
}